

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall
Json::Reader::decodeUnicodeCodePoint
          (Reader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char *pcVar1;
  bool bVar2;
  uint surrogatePair;
  allocator<char> local_51;
  String local_50;
  
  bVar2 = decodeUnicodeEscapeSequence(this,token,current,end,unicode);
  if (bVar2) {
    if ((*unicode & 0xfffffc00) != 0xd800) {
      return true;
    }
    pcVar1 = *current;
    if ((long)end - (long)pcVar1 < 6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "additional six characters expected to parse unicode surrogate pair.",&local_51);
      addError(this,&local_50,token,*current);
    }
    else {
      *current = pcVar1 + 1;
      if ((*pcVar1 == '\\') && (*current = pcVar1 + 2, pcVar1[1] == 'u')) {
        bVar2 = decodeUnicodeEscapeSequence(this,token,current,end,(uint *)&local_50);
        if (!bVar2) {
          return false;
        }
        *unicode = (*unicode & 0x3ff) * 0x400 + ((uint)local_50._M_dataplus._M_p & 0x3ff) + 0x10000;
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "expecting another \\u token to begin the second half of a unicode surrogate pair",
                 &local_51);
      addError(this,&local_50,token,*current);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return false;
}

Assistant:

bool Reader::decodeUnicodeCodePoint(Token& token, Location& current,
                                    Location end, unsigned int& unicode) {

  if (!decodeUnicodeEscapeSequence(token, current, end, unicode))
    return false;
  if (unicode >= 0xD800 && unicode <= 0xDBFF) {
    // surrogate pairs
    if (end - current < 6)
      return addError(
          "additional six characters expected to parse unicode surrogate pair.",
          token, current);
    if (*(current++) == '\\' && *(current++) == 'u') {
      unsigned int surrogatePair;
      if (decodeUnicodeEscapeSequence(token, current, end, surrogatePair)) {
        unicode = 0x10000 + ((unicode & 0x3FF) << 10) + (surrogatePair & 0x3FF);
      } else
        return false;
    } else
      return addError("expecting another \\u token to begin the second half of "
                      "a unicode surrogate pair",
                      token, current);
  }
  return true;
}